

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::CommandRunner::ReadTextModule
          (CommandRunner *this,string_view module_filename,string *header,bool validate)

{
  Result RVar1;
  string_view filename;
  string_view filename_00;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  Errors errors;
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  WastLexer *local_b8;
  _Head_base<0UL,_wabt::Module_*,_false> local_b0;
  Errors local_a8;
  _Head_base<0UL,_wabt::LexerSource_*,_false> local_88;
  bool bStack_80;
  bool bStack_7f;
  bool bStack_7e;
  bool bStack_7d;
  bool bStack_7c;
  bool bStack_7b;
  bool bStack_7a;
  undefined4 uStack_79;
  undefined2 local_75;
  char local_68 [8];
  long lStack_60;
  char *local_58;
  char *local_48 [3];
  
  filename_00._M_str = (wabt *)module_filename._M_len;
  local_68 = (char  [8])0x0;
  lStack_60 = 0;
  local_58 = (char *)0x0;
  filename._M_str = local_68;
  filename._M_len = (size_t)module_filename._M_str;
  RVar1 = wabt::ReadFile(filename_00._M_str,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)header);
  local_a8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  filename_00._M_len = (size_t)&local_b8;
  wabt::WastLexer::CreateBufferLexer
            (filename_00,module_filename._M_str,(size_t)local_68,
             (Errors *)(lStack_60 - (long)local_68));
  if (RVar1.enum_ == Ok) {
    local_b0._M_head_impl = (Module *)0x0;
    local_88._M_head_impl = (LexerSource *)s_features._0_8_;
    bStack_80 = s_features.tail_call_enabled_;
    bStack_7f = s_features.bulk_memory_enabled_;
    bStack_7e = s_features.reference_types_enabled_;
    bStack_7d = s_features.annotations_enabled_;
    bStack_7c = s_features.code_metadata_enabled_;
    bStack_7b = s_features.gc_enabled_;
    bStack_7a = s_features.memory64_enabled_;
    uStack_79 = s_features._15_4_;
    local_75._0_1_ = false;
    local_75._1_1_ = true;
    RVar1 = wabt::ParseWatModule
                      (local_b8,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                                &local_b0,&local_a8,(WastParseOptions *)&local_88);
    if (RVar1.enum_ == Ok && validate) {
      local_48[0] = (char *)s_features._0_8_;
      local_48[1]._0_1_ = s_features.tail_call_enabled_;
      local_48[1]._1_1_ = s_features.bulk_memory_enabled_;
      local_48[1]._2_1_ = s_features.reference_types_enabled_;
      local_48[1]._3_1_ = s_features.annotations_enabled_;
      local_48[1]._4_1_ = s_features.code_metadata_enabled_;
      local_48[1]._5_1_ = s_features.gc_enabled_;
      local_48[1]._6_1_ = s_features.memory64_enabled_;
      local_48._15_4_ = s_features._15_4_;
      RVar1 = wabt::ValidateModule(local_b0._M_head_impl,&local_a8,(ValidateOptions *)local_48);
    }
    std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
              ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)&local_b0);
  }
  wabt::WastLexer::MakeLineFinder((WastLexer *)&local_88);
  wabt::FormatErrorsToFile
            (&local_a8,Text,(LexerSourceLineFinder *)local_88._M_head_impl,_stdout,header,Once,0x50)
  ;
  if ((LexerSourceLineFinder *)local_88._M_head_impl != (LexerSourceLineFinder *)0x0) {
    std::default_delete<wabt::LexerSourceLineFinder>::operator()
              ((default_delete<wabt::LexerSourceLineFinder> *)&local_88,
               (LexerSourceLineFinder *)local_88._M_head_impl);
  }
  if (local_b8 != (WastLexer *)0x0) {
    std::default_delete<wabt::WastLexer>::operator()
              ((default_delete<wabt::WastLexer> *)&local_b8,local_b8);
  }
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_a8);
  if (local_68 != (char  [8])0x0) {
    operator_delete((void *)local_68,(long)local_58 - (long)local_68);
  }
  return (Result)RVar1.enum_;
}

Assistant:

wabt::Result CommandRunner::ReadTextModule(std::string_view module_filename,
                                           const std::string& header,
                                           bool validate) {
  std::vector<uint8_t> file_data;
  wabt::Result result = ReadFile(module_filename, &file_data);
  Errors errors;
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      module_filename, file_data.data(), file_data.size(), &errors);
  if (Succeeded(result)) {
    std::unique_ptr<wabt::Module> module;
    WastParseOptions options(s_features);
    result = ParseWatModule(lexer.get(), &module, &errors, &options);

    if (validate && Succeeded(result)) {
      result =
          ValidateModule(module.get(), &errors, ValidateOptions{s_features});
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get(), stdout,
                     header, PrintHeader::Once);
  return result;
}